

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O3

string * __thiscall
CECoordinates::print_abi_cxx11_(string *__return_storage_ptr__,CECoordinates *this)

{
  double __val;
  double __val_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"Coordinates:\n",(allocator *)&bStack_78);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&bStack_78);
  std::__cxx11::to_string(&local_58,this->coord_type_);
  std::operator+(&local_38,"   - System : ",&local_58);
  std::operator+(&bStack_78,&local_38,"\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  CppEphem::julian_date_J2000();
  (*this->_vptr_CECoordinates[6])(this);
  std::__cxx11::to_string(&local_58,__val);
  std::operator+(&local_38,"   - X-coord: ",&local_58);
  std::operator+(&bStack_78,&local_38," deg\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  CppEphem::julian_date_J2000();
  (*this->_vptr_CECoordinates[8])(this);
  std::__cxx11::to_string(&local_58,__val_00);
  std::operator+(&local_38,"   - Y-coord: ",&local_58);
  std::operator+(&bStack_78,&local_38," deg\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&bStack_78);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string CECoordinates::print(void) const
{
    std::string msg = "Coordinates:\n";
    msg += "   - System : " + std::to_string(int(coord_type_)) + "\n";
    msg += "   - X-coord: " + std::to_string(XCoordinate_Deg()) + " deg\n";
    msg += "   - Y-coord: " + std::to_string(YCoordinate_Deg()) + " deg\n";
    return msg;
}